

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O1

QRect __thiscall
QPixmapStyle::comboBoxSubControlRect
          (QPixmapStyle *this,QStyleOptionComplex *option,SubControl sc,QWidget *param_3)

{
  long lVar1;
  int *piVar2;
  QRect QVar3;
  int iVar4;
  int iVar5;
  Representation RVar6;
  Representation RVar7;
  long in_FS_OFFSET;
  ControlDescriptor local_ac;
  QPixmapStyleDescriptor local_a8;
  QPixmapStylePixmap local_70;
  QRect local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  local_48 = (option->super_QStyleOption).rect;
  local_a8.fileName.d.d._0_4_ = 0x11;
  QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
            (&local_70,(QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)(lVar1 + 0xf0),
             (ControlPixmap *)&local_a8);
  local_ac = DD_ButtonEnabled;
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
            (&local_a8,
             (QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)(lVar1 + 0xe8),
             &local_ac);
  QVar3 = local_48;
  RVar7.m_i = local_48.x2.m_i;
  if (sc == SC_ComboBoxEditField) {
    local_48.y1.m_i = local_48.y1.m_i + local_a8.margins.m_right.m_i;
    local_48.x1.m_i = local_48.x1.m_i + local_a8.margins.m_left.m_i;
    iVar5 = local_48.x2.m_i - local_a8.margins.m_right.m_i;
    local_48.y2.m_i = QVar3.y2.m_i.m_i - local_a8.margins.m_bottom.m_i;
    local_48.x2.m_i = iVar5;
    iVar4 = QPixmap::width();
    local_48.x2.m_i = iVar5 - (iVar4 + local_70.margins.m_right.m_i + local_70.margins.m_left.m_i);
  }
  else if (sc == SC_ComboBoxArrow) {
    iVar4 = QPixmap::width();
    RVar7.m_i = RVar7.m_i - (iVar4 + local_70.margins.m_right.m_i);
    RVar6.m_i = local_70.margins.m_top.m_i + local_48.y1.m_i;
    iVar4 = QPixmap::width();
    iVar5 = QPixmap::height();
    local_48.y1.m_i = RVar6.m_i;
    local_48.x1.m_i = RVar7.m_i;
    local_48.x2.m_i = iVar4 + RVar7.m_i + -1;
    local_48.y2.m_i = iVar5 + RVar6.m_i + -1;
  }
  local_48 = QStyle::visualRect((option->super_QStyleOption).direction,
                                &(option->super_QStyleOption).rect,&local_48);
  piVar2 = (int *)CONCAT44(local_a8.fileName.d.d._4_4_,local_a8.fileName.d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if (*piVar2 == 0) {
      QArrayData::deallocate
                ((QArrayData *)CONCAT44(local_a8.fileName.d.d._4_4_,local_a8.fileName.d.d._0_4_),2,
                 0x10);
    }
  }
  QPixmap::~QPixmap(&local_70.pixmap);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return local_48;
  }
  __stack_chk_fail();
}

Assistant:

QRect QPixmapStyle::comboBoxSubControlRect(const QStyleOptionComplex *option,
                                           QStyle::SubControl sc, const QWidget *) const
{
    Q_D(const QPixmapStyle);

    QRect r = option->rect; // Default size
    const QPixmapStylePixmap &pix = d->pixmaps.value(DD_ArrowEnabled);
    const QPixmapStyleDescriptor &desc = d->descriptors.value(DD_ButtonEnabled);

    switch (sc) {
    case SC_ComboBoxArrow:
        r.setRect(r.right() - pix.margins.right() - pix.pixmap.width(),
                    r.top() + pix.margins.top(),
                    pix.pixmap.width(), pix.pixmap.height());
        break;
    case SC_ComboBoxEditField:
        r.adjust(desc.margins.left(), desc.margins.right(),
                 -desc.margins.right(), -desc.margins.bottom());
        r.setRight(r.right() - pix.margins.right() - pix.margins.left() - pix.pixmap.width());
        break;
    default:
        break;
    }

    r = visualRect(option->direction, option->rect, r);
    return r;
}